

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

SymOpnd * Lowerer::LoadCallInfo(Instr *instrInsert)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  JITTimeFunctionBody *this;
  Instr *pIVar4;
  undefined4 *puVar5;
  IndirOpnd *src;
  RegOpnd *pRVar6;
  StackSym *sym;
  SymOpnd *pSVar7;
  
  func = instrInsert->m_func;
  this = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this);
  if (bVar2) {
    pIVar4 = LoadGeneratorObject(instrInsert);
    pRVar6 = (RegOpnd *)pIVar4->m_dst;
    OVar3 = IR::Opnd::GetKind((Opnd *)pRVar6);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    src = IR::IndirOpnd::New(pRVar6,0x30,TyUint64,func,false);
    pRVar6 = IR::RegOpnd::New(TyUint64,func);
    pIVar4 = InsertMove(&pRVar6->super_Opnd,&src->super_Opnd,instrInsert,true);
    sym = StackSym::New(TyInt64,func);
    pSVar7 = IR::SymOpnd::New(&sym->super_Sym,TyInt64,func);
    InsertMove(&pSVar7->super_Opnd,pIVar4->m_dst,instrInsert,true);
  }
  else {
    sym = LowererMD::GetImplicitParamSlotSym(1,func);
  }
  pSVar7 = IR::SymOpnd::New(&sym->super_Sym,TyInt64,func);
  return pSVar7;
}

Assistant:

IR::SymOpnd *
Lowerer::LoadCallInfo(IR::Instr * instrInsert)
{
    IR::SymOpnd * srcOpnd;
    Func * func = instrInsert->m_func;

    if (func->GetJITFunctionBody()->IsCoroutine())
    {
        // Generator function arguments and ArgumentsInfo are not on the stack.  Instead they
        // are accessed off the generator object (which is prm1).
        IR::Instr *genLoadInstr = LoadGeneratorObject(instrInsert);
        IR::RegOpnd * generatorRegOpnd = genLoadInstr->GetDst()->AsRegOpnd();

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorRegOpnd, Js::JavascriptGenerator::GetCallInfoOffset(), TyMachPtr, func);
        IR::Instr * instr = Lowerer::InsertMove(IR::RegOpnd::New(TyMachPtr, func), indirOpnd, instrInsert);

        StackSym * callInfoSym = StackSym::New(TyMachReg, func);
        IR::SymOpnd * callInfoSymOpnd = IR::SymOpnd::New(callInfoSym, TyMachReg, func);
        Lowerer::InsertMove(callInfoSymOpnd, instr->GetDst(), instrInsert);

        srcOpnd = IR::SymOpnd::New(callInfoSym, TyMachReg, func);
    }
    else
    {
        // Otherwise callInfo is always the "second" argument.
        // The stack looks like this:
        //
        //       script param N
        //       ...
        //       script param 1
        //       callinfo
        //       function object
        //       return addr
        // FP -> FP chain

        StackSym * srcSym = LowererMD::GetImplicitParamSlotSym(1, func);
        srcOpnd = IR::SymOpnd::New(srcSym, TyMachReg, func);
    }

    return srcOpnd;
}